

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O0

MPP_RET mpp_dec_proc_cfg(MppDecImpl *dec,MpiCmd cmd,void *param)

{
  uint uVar1;
  MppFrameFormat MVar2;
  RK_U32 RVar3;
  RK_U32 RVar4;
  RK_U32 RVar5;
  RK_U32 RVar6;
  RK_S32 RVar7;
  MppDecCfgImpl *dec_cfg_1;
  MppDecCfgImpl *dec_cfg;
  RK_U32 flag;
  MppDecQueryCfg *query;
  RK_S32 *p;
  MppFrame frame;
  MPP_RET ret;
  void *param_local;
  MpiCmd cmd_local;
  MppDecImpl *dec_local;
  
  mpp_parser_control(dec->parser,cmd,param);
  frame._4_4_ = mpp_hal_control(dec->hal,cmd,param);
  if (frame._4_4_ == MPP_OK) {
    if (cmd == MPP_DEC_SET_FRAME_INFO) {
      MVar2 = mpp_frame_get_fmt(param);
      (dec->cfg).base.out_fmt = MVar2;
      _mpp_log_l(4,"mpp_dec","found MPP_DEC_SET_FRAME_INFO fmt %x\n","mpp_dec_proc_cfg",
                 (ulong)(dec->cfg).base.out_fmt);
      mpp_slots_set_prop(dec->frame_slots,SLOTS_FRAME_INFO,param);
      RVar3 = mpp_frame_get_width(param);
      RVar4 = mpp_frame_get_height(param);
      RVar5 = mpp_frame_get_hor_stride(param);
      RVar6 = mpp_frame_get_ver_stride(param);
      _mpp_log_l(4,"mpp_dec","setting default w %4d h %4d h_str %4d v_str %4d\n",(char *)0x0,
                 (ulong)RVar3,(ulong)RVar4,RVar5,RVar6);
    }
    else if (cmd == MPP_DEC_SET_INFO_CHANGE_READY) {
      frame._4_4_ = mpp_buf_slot_ready(dec->frame_slots);
    }
    else {
      if (2 < cmd - MPP_DEC_SET_PRESENT_TIME_ORDER) {
        if (cmd == MPP_DEC_GET_VPUMEM_USED_COUNT) {
          RVar7 = mpp_slots_get_used_count(dec->frame_slots);
          *(RK_S32 *)param = RVar7;
          if ((mpp_dec_debug & 1) == 0) {
            return MPP_OK;
          }
          _mpp_log_l(4,"mpp_dec","used count %d\n","mpp_dec_proc_cfg",(ulong)*param);
          return MPP_OK;
        }
        if ((((4 < cmd - MPP_DEC_SET_OUTPUT_FORMAT) && (cmd != MPP_DEC_SET_ENABLE_MVC)) &&
            (cmd != MPP_DEC_SET_DISABLE_DPB_CHECK)) && (cmd != MPP_DEC_SET_DIS_ERR_CLR_MARK)) {
          if (cmd == MPP_DEC_QUERY) {
            uVar1 = *param;
            if ((mpp_dec_debug & 1) != 0) {
              _mpp_log_l(4,"mpp_dec","query %x\n","mpp_dec_proc_cfg",(ulong)uVar1);
            }
            if ((uVar1 & 1) != 0) {
              *(RK_U32 *)((long)param + 4) = dec->parser_status_flag;
            }
            if ((uVar1 & 2) != 0) {
              *(RK_U32 *)((long)param + 8) = dec->parser_wait_flag;
            }
            if ((uVar1 & 4) != 0) {
              *(undefined4 *)((long)param + 0xc) = 0;
            }
            if ((uVar1 & 8) != 0) {
              *(undefined4 *)((long)param + 0x10) = 0;
            }
            if ((uVar1 & 0x10) != 0) {
              *(RK_U32 *)((long)param + 0x14) = dec->dec_in_pkt_count;
            }
            if ((uVar1 & 0x20) != 0) {
              *(RK_U32 *)((long)param + 0x18) = dec->dec_hw_run_count;
            }
            if ((uVar1 & 0x40) == 0) {
              return MPP_OK;
            }
            *(RK_U32 *)((long)param + 0x1c) = dec->dec_out_frame_count;
            return MPP_OK;
          }
          if (cmd == MPP_DEC_SET_CFG) {
            if (param != (void *)0x0) {
              mpp_dec_set_cfg(&dec->cfg,(MppDecCfgSet *)((long)param + 8));
              mpp_dec_update_cfg(dec);
              mpp_dec_check_fbc_cap(dec);
            }
            if ((mpp_dec_debug & 1) == 0) {
              return MPP_OK;
            }
            _mpp_log_l(4,"mpp_dec","set dec cfg\n","mpp_dec_proc_cfg");
            return MPP_OK;
          }
          if (cmd != MPP_DEC_GET_CFG) {
            return MPP_OK;
          }
          if (param != (void *)0x0) {
            memcpy((void *)((long)param + 8),&dec->cfg,0xa0);
          }
          if ((mpp_dec_debug & 1) == 0) {
            return MPP_OK;
          }
          _mpp_log_l(4,"mpp_dec","get dec cfg\n","mpp_dec_proc_cfg");
          return MPP_OK;
        }
      }
      frame._4_4_ = mpp_dec_set_cfg_by_cmd(&dec->cfg,cmd,param);
      mpp_dec_update_cfg(dec);
      mpp_dec_check_fbc_cap(dec);
      (dec->cfg).base.change = 0;
    }
  }
  return frame._4_4_;
}

Assistant:

MPP_RET mpp_dec_proc_cfg(MppDecImpl *dec, MpiCmd cmd, void *param)
{
    MPP_RET ret = MPP_OK;

    mpp_parser_control(dec->parser, cmd, param);

    ret = mpp_hal_control(dec->hal, cmd, param);

    if (ret)
        goto RET;

    switch (cmd) {
    case MPP_DEC_SET_FRAME_INFO : {
        MppFrame frame = (MppFrame)param;

        /* update output frame format */
        dec->cfg.base.out_fmt = mpp_frame_get_fmt(frame);
        mpp_log_f("found MPP_DEC_SET_FRAME_INFO fmt %x\n", dec->cfg.base.out_fmt);

        mpp_slots_set_prop(dec->frame_slots, SLOTS_FRAME_INFO, frame);

        mpp_log("setting default w %4d h %4d h_str %4d v_str %4d\n",
                mpp_frame_get_width(frame),
                mpp_frame_get_height(frame),
                mpp_frame_get_hor_stride(frame),
                mpp_frame_get_ver_stride(frame));

    } break;
    case MPP_DEC_SET_INFO_CHANGE_READY: {
        ret = mpp_buf_slot_ready(dec->frame_slots);
    } break;
    case MPP_DEC_GET_VPUMEM_USED_COUNT: {
        RK_S32 *p = (RK_S32 *)param;
        *p = mpp_slots_get_used_count(dec->frame_slots);
        dec_dbg_func("used count %d\n", *p);
    } break;
    case MPP_DEC_SET_PRESENT_TIME_ORDER :
    case MPP_DEC_SET_PARSER_SPLIT_MODE :
    case MPP_DEC_SET_PARSER_FAST_MODE :
    case MPP_DEC_SET_IMMEDIATE_OUT :
    case MPP_DEC_SET_OUTPUT_FORMAT :
    case MPP_DEC_SET_DISABLE_ERROR :
    case MPP_DEC_SET_DIS_ERR_CLR_MARK :
    case MPP_DEC_SET_ENABLE_DEINTERLACE :
    case MPP_DEC_SET_ENABLE_FAST_PLAY :
    case MPP_DEC_SET_ENABLE_MVC :
    case MPP_DEC_SET_DISABLE_DPB_CHECK: {
        ret = mpp_dec_set_cfg_by_cmd(&dec->cfg, cmd, param);
        mpp_dec_update_cfg(dec);
        mpp_dec_check_fbc_cap(dec);
        dec->cfg.base.change = 0;
    } break;
    case MPP_DEC_QUERY: {
        MppDecQueryCfg *query = (MppDecQueryCfg *)param;
        RK_U32 flag = query->query_flag;

        dec_dbg_func("query %x\n", flag);

        if (flag & MPP_DEC_QUERY_STATUS)
            query->rt_status = dec->parser_status_flag;

        if (flag & MPP_DEC_QUERY_WAIT)
            query->rt_wait = dec->parser_wait_flag;

        if (flag & MPP_DEC_QUERY_FPS)
            query->rt_fps = 0;

        if (flag & MPP_DEC_QUERY_BPS)
            query->rt_bps = 0;

        if (flag & MPP_DEC_QUERY_DEC_IN_PKT)
            query->dec_in_pkt_cnt = dec->dec_in_pkt_count;

        if (flag & MPP_DEC_QUERY_DEC_WORK)
            query->dec_hw_run_cnt = dec->dec_hw_run_count;

        if (flag & MPP_DEC_QUERY_DEC_OUT_FRM)
            query->dec_out_frm_cnt = dec->dec_out_frame_count;
    } break;
    case MPP_DEC_SET_CFG: {
        MppDecCfgImpl *dec_cfg = (MppDecCfgImpl *)param;

        if (dec_cfg) {
            mpp_dec_set_cfg(&dec->cfg, &dec_cfg->cfg);
            mpp_dec_update_cfg(dec);
            mpp_dec_check_fbc_cap(dec);
        }

        dec_dbg_func("set dec cfg\n");
    } break;
    case MPP_DEC_GET_CFG: {
        MppDecCfgImpl *dec_cfg = (MppDecCfgImpl *)param;

        if (dec_cfg)
            memcpy(&dec_cfg->cfg, &dec->cfg, sizeof(dec->cfg));

        dec_dbg_func("get dec cfg\n");
    } break;
    default : {
    } break;
    }

RET:
    return ret;
}